

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O1

int Io_ReadPlaSelfSubsumption(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  ulong uVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  word *pwVar5;
  word *pwVar6;
  byte bVar7;
  bool bVar8;
  uint uVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  size_t __size;
  ulong uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  int local_90;
  ulong local_68;
  
  iVar18 = nCubes >> 5;
  if (vMarks->nCap < nCubes) {
    iVar15 = (iVar18 + 1) - (uint)((nCubes & 0x1fU) == 0);
    __size = (long)iVar15 << 2;
    if (vMarks->pArray == (int *)0x0) {
      piVar10 = (int *)malloc(__size);
    }
    else {
      piVar10 = (int *)realloc(vMarks->pArray,__size);
    }
    vMarks->pArray = piVar10;
    if (piVar10 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
    }
    vMarks->nCap = iVar15 * 0x20;
  }
  uVar21 = (uint)((nCubes & 0x1fU) != 0);
  iVar15 = uVar21 + iVar18;
  if (iVar15 != 0 && SCARRY4(uVar21,iVar18) == iVar15 < 0) {
    memset(vMarks->pArray,0,(ulong)(iVar15 - 1) * 4 + 4);
  }
  vMarks->nSize = iVar15 * 0x20;
  if (nCubes < 1) {
    return 0;
  }
  uVar14 = (ulong)(uint)nWords;
  uVar24 = (ulong)(uint)nCubes;
  uVar21 = 0xffffffff;
  local_68 = 1;
  local_90 = 0;
  uVar11 = 0;
LAB_00330f13:
  if ((long)vMarks->nSize <= (long)uVar11) {
LAB_003311ec:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                  ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
  }
  piVar10 = vMarks->pArray;
  uVar13 = uVar11 >> 5 & 0x7ffffff;
  uVar3 = piVar10[uVar13];
  uVar16 = (uint)uVar11 & 0x1f;
  uVar1 = uVar11 + 1;
  if (uVar1 < uVar24 && (uVar3 >> uVar16 & 1) == 0) {
    uVar12 = local_68;
    do {
      if (uVar12 == (uint)vMarks->nSize) goto LAB_003311ec;
      uVar17 = uVar12 >> 5 & 0x7ffffff;
      uVar4 = piVar10[uVar17];
      uVar20 = (uint)uVar12 & 0x1f;
      if ((uVar4 >> uVar20 & 1) == 0) {
        pwVar5 = pCs[uVar11];
        pwVar6 = pCs[uVar12];
        if (nWords < 1) {
          bVar26 = true;
        }
        else {
          iVar18 = 0;
          uVar23 = 0;
          bVar8 = false;
          do {
            if (pwVar5[uVar23] != pwVar6[uVar23]) {
              bVar26 = false;
              if (bVar8) break;
              uVar25 = pwVar6[uVar23] ^ pwVar5[uVar23];
              uVar25 = uVar25 >> 1 & uVar25;
              uVar22 = uVar25 & 0x5555555555555555;
              if ((uVar22 ^ uVar22 - 1) <= uVar22 - 1) break;
              bVar26 = (uVar25 & 0x55555555) == 0;
              uVar25 = uVar22 >> 0x20;
              if (!bVar26) {
                uVar25 = uVar22;
              }
              iVar19 = (uint)bVar26 * 0x20;
              iVar15 = iVar19 + 0x10;
              uVar22 = uVar25 >> 0x10;
              if ((uVar25 & 0x5555) != 0) {
                iVar15 = iVar19;
                uVar22 = uVar25;
              }
              iVar19 = iVar15 + 8;
              uVar25 = uVar22 >> 8;
              if ((uVar22 & 0x55) != 0) {
                iVar19 = iVar15;
                uVar25 = uVar22;
              }
              iVar15 = iVar19 + 4;
              uVar22 = uVar25 >> 4;
              if ((uVar25 & 0xf) != 0) {
                iVar15 = iVar19;
                uVar22 = uVar25;
              }
              uVar21 = (uint)(uVar22 >> 2) & 0x3fffffff;
              iVar19 = iVar15 + 2;
              if ((uVar22 & 3) != 0) {
                uVar21 = (uint)uVar22;
                iVar19 = iVar15;
              }
              uVar21 = ((~uVar21 & 1) + iVar19 >> 1) + iVar18;
              bVar8 = true;
            }
            uVar23 = uVar23 + 1;
            iVar18 = iVar18 + 0x20;
            bVar26 = bVar8;
          } while (uVar14 != uVar23);
          bVar26 = !bVar26;
        }
        if (!bVar26) {
          if (((int)uVar21 < 0) || (nWords << 5 <= (int)uVar21)) {
            __assert_fail("iVar >= 0 && iVar < nWords*32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadPla.c"
                          ,0xbd,"int Io_ReadPlaSelfSubsumption(word **, int, int, Vec_Bit_t *)");
          }
          uVar9 = uVar21 >> 5;
          uVar23 = (ulong)(uVar9 * 8);
          bVar7 = (char)uVar21 * '\x02';
          uVar11 = *(ulong *)((long)pwVar6 + uVar23);
          uVar12 = (ulong)((uint)(*(ulong *)((long)pwVar5 + uVar23) >> (bVar7 & 0x3f)) & 3) <<
                   (bVar7 & 0x3f);
          *(ulong *)((long)pwVar5 + uVar23) = *(ulong *)((long)pwVar5 + uVar23) ^ uVar12;
          uVar25 = (ulong)((uint)(uVar11 >> (bVar7 & 0x3f)) & 3) << (bVar7 & 0x3f);
          uVar11 = *(ulong *)((long)pwVar6 + uVar23);
          *(ulong *)((long)pwVar6 + uVar23) = uVar25 ^ uVar11;
          if (nWords < 1) goto LAB_0033115c;
          uVar23 = 0;
          goto LAB_00331146;
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar24);
  }
  goto LAB_003311ae;
  while (uVar23 = uVar23 + 1, uVar14 != uVar23) {
LAB_00331146:
    if ((pwVar5[uVar23] & ~pwVar6[uVar23]) != 0) {
      if (nWords < 1) goto LAB_0033118d;
      uVar17 = 0;
      goto LAB_00331177;
    }
  }
LAB_0033115c:
  pwVar5[uVar9] = pwVar5[uVar9] ^ uVar12;
  piVar10[uVar17] = uVar4 | 1 << uVar20;
  goto LAB_003311aa;
  while (uVar17 = uVar17 + 1, uVar14 != uVar17) {
LAB_00331177:
    if ((pwVar6[uVar17] & ~pwVar5[uVar17]) != 0) {
      puVar2 = (ulong *)((long)pwVar5 + (ulong)(uVar9 << 3));
      *puVar2 = *puVar2 ^ uVar12;
      puVar2 = (ulong *)((long)pwVar6 + (ulong)(uVar9 << 3));
      *puVar2 = *puVar2 ^ uVar25;
      goto LAB_003311ae;
    }
  }
LAB_0033118d:
  pwVar6[uVar9] = uVar11;
  piVar10[uVar13] = uVar3 | 1 << uVar16;
LAB_003311aa:
  local_90 = local_90 + 1;
LAB_003311ae:
  local_68 = local_68 + 1;
  uVar11 = uVar1;
  if (uVar1 == uVar24) {
    return local_90;
  }
  goto LAB_00330f13;
}

Assistant:

int Io_ReadPlaSelfSubsumption( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2, Res, Counter = 0, iVar = -1, Val0, Val1;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                {
                    Res = Io_ReadPlaConsensus( pCs[c1], pCs[c2], nWords, &iVar );
                    if ( !Res )
                        continue;
                    assert( iVar >= 0  && iVar < nWords*32 );
                    Val0 = Abc_TtGetQua( pCs[c1], iVar );
                    Val1 = Abc_TtGetQua( pCs[c2], iVar );
                    // remove values
                    Abc_TtXorQua( pCs[c1], iVar, Val0 );
                    Abc_TtXorQua( pCs[c2], iVar, Val1 );
                    // check containment
                    if ( Abc_TtImply(pCs[c1], pCs[c2], nWords) )
                    {
                        Abc_TtXorQua( pCs[c1], iVar, Val0 );
                        Vec_BitWriteEntry( vMarks, c2, 1 );
                        Counter++;
                    }
                    else if ( Abc_TtImply(pCs[c2], pCs[c1], nWords) )
                    {
                        Abc_TtXorQua( pCs[c2], iVar, Val1 );
                        Vec_BitWriteEntry( vMarks, c1, 1 );
                        Counter++;
                        break;
                    }
                    else
                    {
                        Abc_TtXorQua( pCs[c1], iVar, Val0 );
                        Abc_TtXorQua( pCs[c2], iVar, Val1 );
                    }

/*
                    printf( "Var = %3d  ", iVar );
                    printf( "Cube0 = %d  ", Abc_TtGetQua(pCs[c1], iVar) );
                    printf( "Cube1 = %d  ", Abc_TtGetQua(pCs[c2], iVar) );
                    printf( "\n" );
                    Io_ReadPlaPrintCube( pCs[c1], 32 * nWords );
                    Io_ReadPlaPrintCube( pCs[c2], 32 * nWords );
                    printf( "\n" );
*/
                    break;
                }
    return Counter;
}